

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::InlineReader::PerformGets(InlineReader *this)

{
  int iVar1;
  ostream *poVar2;
  ScopedTimer __var2110;
  ScopedTimer local_10;
  
  if (PerformGets()::__var110 == '\0') {
    iVar1 = __cxa_guard_acquire(&PerformGets()::__var110);
    if (iVar1 != 0) {
      PerformGets::__var110 = (void *)ps_timer_create_("InlineReader::PerformGets");
      __cxa_guard_release(&PerformGets()::__var110);
    }
  }
  local_10.m_timer = PerformGets::__var110;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  if (this->m_Verbosity == 5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inline Reader ",0xe);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->m_ReaderRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"     PerformGets()\n",0x13);
  }
  SetDeferredVariablePointers(this);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_10);
  return;
}

Assistant:

void InlineReader::PerformGets()
{
    PERFSTUBS_SCOPED_TIMER("InlineReader::PerformGets");
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Reader " << m_ReaderRank << "     PerformGets()\n";
    }
    SetDeferredVariablePointers();
}